

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_law_expansion.cc
# Opt level: O0

bool __thiscall sptk::ALawExpansion::Run(ALawExpansion *this,double input,double *output)

{
  int iVar1;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double y;
  double z;
  double x;
  undefined8 local_38;
  undefined1 local_1;
  
  if (((*(byte *)(in_RDI + 0x20) & 1) == 0) || (in_RSI == (double *)0x0)) {
    local_1 = false;
  }
  else {
    dVar2 = ABS(in_XMM0_Qa) / *(double *)(in_RDI + 8);
    dVar3 = log(*(double *)(in_RDI + 0x10));
    local_38 = (dVar3 + 1.0) * dVar2;
    if (1.0 / (dVar3 + 1.0) <= dVar2) {
      local_38 = exp(local_38 - 1.0);
    }
    dVar2 = *(double *)(in_RDI + 0x18);
    iVar1 = ExtractSign(in_XMM0_Qa);
    *in_RSI = dVar2 * (double)iVar1 * local_38;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ALawExpansion::Run(double input, double* output) const {
  if (!is_valid_ || NULL == output) {
    return false;
  }

  const double x(std::fabs(input) / abs_max_value_);
  const double z(1 + std::log(compression_factor_));
  double y(z * x);
  if (1.0 / z <= x) {
    y = std::exp(y - 1.0);
  }
  *output = constant_ * sptk::ExtractSign(input) * y;

  return true;
}